

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O3

void __thiscall GLPortal::ClearClipper(GLPortal *this)

{
  GLWall *pGVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  angle_t aVar5;
  angle_t aVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  
  dVar2 = ViewAngle.Degrees - (this->savedAngle).Degrees;
  Clipper::Clear(&clipper);
  Clipper::AddClipRange(&clipper,0,0xffffffff);
  if ((this->lines).Count != 0) {
    dVar2 = (double)SUB84(dVar2 * 11930464.711111112 + 6755399441055744.0,0) * 8.381903171539307e-08
    ;
    lVar8 = 8;
    uVar7 = 0;
    do {
      pGVar1 = (this->lines).Array;
      dVar3 = c_atan2((double)*(float *)((long)pGVar1->vertexes + lVar8 + -0x14) -
                      (this->savedViewPos).Y,
                      (double)*(float *)((long)pGVar1->vertexes + lVar8 + -0x1c) -
                      (this->savedViewPos).X);
      pGVar1 = (this->lines).Array;
      dVar4 = c_atan2((double)*(float *)((long)pGVar1->vertexes + lVar8 + -0x18) -
                      (this->savedViewPos).Y,
                      (double)*(float *)((long)pGVar1->vertexes + lVar8 + -0x20) -
                      (this->savedViewPos).X);
      if ((double)SUB84((dVar3 * 57.29577951308232 - dVar4 * 57.29577951308232) * 11930464.711111112
                        + 6755399441055744.0,0) * 8.381903171539307e-08 < 0.0) {
        aVar5 = Clipper::AngleToPseudo
                          (SUB84((dVar3 * 57.29577951308232 + dVar2) * 11930464.711111112 +
                                 6755399441055744.0,0));
        aVar6 = Clipper::AngleToPseudo
                          (SUB84((dVar4 * 57.29577951308232 + dVar2) * 11930464.711111112 +
                                 6755399441055744.0,0));
        Clipper::SafeRemoveClipRange(&clipper,aVar5,aVar6);
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x140;
    } while (uVar7 < (this->lines).Count);
  }
  aVar5 = FGLRenderer::FrustumAngle(GLRenderer);
  if (-1 < (int)aVar5) {
    iVar9 = SUB84(ViewAngle.Degrees * 11930464.711111112 + 6755399441055744.0,0);
    aVar6 = Clipper::AngleToPseudo(aVar5 + iVar9);
    aVar5 = Clipper::AngleToPseudo(iVar9 - aVar5);
    Clipper::SafeAddClipRange(&clipper,aVar6,aVar5);
  }
  Clipper::SetSilhouette(&clipper);
  return;
}

Assistant:

inline void GLPortal::ClearClipper()
{
	DAngle angleOffset = deltaangle(savedAngle, ViewAngle);

	clipper.Clear();

	static int call=0;

	// Set the clipper to the minimal visible area
	clipper.SafeAddClipRange(0,0xffffffff);
	for (unsigned int i = 0; i < lines.Size(); i++)
	{
		DAngle startAngle = (DVector2(lines[i].glseg.x2, lines[i].glseg.y2) - savedViewPos).Angle() + angleOffset;
		DAngle endAngle = (DVector2(lines[i].glseg.x1, lines[i].glseg.y1) - savedViewPos).Angle() + angleOffset;

		if (deltaangle(endAngle, startAngle) < 0)
		{
			clipper.SafeRemoveClipRangeRealAngles(startAngle.BAMs(), endAngle.BAMs());
		}
	}

	// and finally clip it to the visible area
	angle_t a1 = GLRenderer->FrustumAngle();
	if (a1 < ANGLE_180) clipper.SafeAddClipRangeRealAngles(ViewAngle.BAMs() + a1, ViewAngle.BAMs() - a1);

	// lock the parts that have just been clipped out.
	clipper.SetSilhouette();
}